

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryNumericDivideHugeintWrapper,duckdb::ModuloOperator,bool>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  idx_t iVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  idx_t idx_in_entry;
  idx_t idx;
  ulong idx_00;
  idx_t iVar11;
  ulong uVar12;
  int64_t *piVar13;
  hugeint_t hVar14;
  hugeint_t left;
  hugeint_t right;
  hugeint_t right_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      piVar13 = &result_data->upper;
      idx = 0;
      do {
        iVar7 = idx;
        if (psVar1 != (sel_t *)0x0) {
          iVar7 = (idx_t)psVar1[idx];
        }
        iVar11 = idx;
        if (psVar2 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar2[idx];
        }
        left.upper = ldata[iVar7].upper;
        left.lower = ldata[iVar7].lower;
        right.upper = rdata[iVar11].upper;
        right.lower = rdata[iVar11].lower;
        hVar14 = BinaryNumericDivideHugeintWrapper::
                 Operation<bool,duckdb::ModuloOperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                           (fun,left,right,result_validity,idx);
        ((hugeint_t *)(piVar13 + -1))->lower = hVar14.lower;
        *piVar13 = hVar14.upper;
        idx = idx + 1;
        piVar13 = piVar13 + 2;
      } while (count != idx);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar13 = &result_data->upper;
    idx_00 = 0;
    do {
      uVar8 = idx_00;
      if (psVar1 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar1[idx_00];
      }
      uVar12 = idx_00;
      if (psVar2 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar2[idx_00];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0)))) {
        hVar14.upper = ldata[uVar8].upper;
        hVar14.lower = ldata[uVar8].lower;
        right_00.upper = rdata[uVar12].upper;
        right_00.lower = rdata[uVar12].lower;
        hVar14 = BinaryNumericDivideHugeintWrapper::
                 Operation<bool,duckdb::ModuloOperator,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                           (fun,hVar14,right_00,result_validity,idx_00);
        ((hugeint_t *)(piVar13 + -1))->lower = hVar14.lower;
        *piVar13 = hVar14.upper;
      }
      else {
        _Var10._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var10._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var6 = p_Stack_50;
          peVar5 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var10._M_head_impl =
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var10._M_head_impl;
        }
        bVar4 = (byte)idx_00 & 0x3f;
        _Var10._M_head_impl[idx_00 >> 6] =
             _Var10._M_head_impl[idx_00 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4)
        ;
      }
      idx_00 = idx_00 + 1;
      piVar13 = piVar13 + 2;
    } while (count != idx_00);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}